

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O2

Reals __thiscall
Omega_h::compute_flip_normals_dim<3>
          (Omega_h *this,Mesh *mesh,Bytes *sides_are_exposed,Bytes *verts_matter,
          Real simple_algorithm_threshold)

{
  LO LVar1;
  void *extraout_RDX;
  ulong uVar2;
  Reals RVar3;
  Bytes sides_are_exposed_copy;
  Write<double> out;
  LOs verts_that_matter;
  Write<double> local_138;
  Write<double> local_128;
  Reals coords;
  Write<signed_char> local_108;
  LOs sv2v;
  type f;
  Adj v2s;
  
  Mesh::ask_up(&v2s,mesh,0,2);
  Mesh::ask_verts_of((Mesh *)&sv2v,(Int)mesh);
  Write<signed_char>::Write(&local_108,&verts_matter->write_);
  collect_marked((Omega_h *)&verts_that_matter,(Read<signed_char> *)&local_108);
  Write<signed_char>::~Write(&local_108);
  Mesh::coords((Mesh *)&coords);
  LVar1 = Mesh::nverts(mesh);
  std::__cxx11::string::string((string *)&f,"",(allocator *)&sides_are_exposed_copy);
  Write<double>::Write(&out,LVar1 * 3,0.0,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<signed_char>::Write(&sides_are_exposed_copy.write_,&sides_are_exposed->write_);
  Write<int>::Write((Write<int> *)&f,&verts_that_matter.write_);
  Adj::Adj(&f.v2s,&v2s);
  Write<signed_char>::Write(&f.sides_are_exposed_copy.write_,&sides_are_exposed_copy.write_);
  Write<int>::Write(&f.sv2v.write_,&sv2v.write_);
  Write<double>::Write(&f.coords.write_,&coords.write_);
  f.threshold_copy = simple_algorithm_threshold;
  Write<double>::Write(&f.out,&out);
  if (((ulong)verts_that_matter.write_.shared_alloc_.alloc & 1) == 0) {
    uVar2 = (verts_that_matter.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar2 = (ulong)verts_that_matter.write_.shared_alloc_.alloc >> 3;
  }
  parallel_for<Omega_h::compute_flip_normals_dim<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,double)::_lambda(int)_1_>
            ((LO)(uVar2 >> 2),&f,"compute_flip_normals");
  Write<double>::Write(&local_138,&out);
  Read<double>::Read((Read<signed_char> *)&local_128,&local_138);
  Mesh::sync_array<double>((Mesh *)this,(Int)mesh,(Read<double> *)0x0,(Int)&local_128);
  Write<double>::~Write(&local_128);
  Write<double>::~Write(&local_138);
  compute_flip_normals_dim<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,double)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&f);
  Write<signed_char>::~Write(&sides_are_exposed_copy.write_);
  Write<double>::~Write(&out);
  Write<double>::~Write(&coords.write_);
  Write<int>::~Write(&verts_that_matter.write_);
  Write<int>::~Write(&sv2v.write_);
  Adj::~Adj(&v2s);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals compute_flip_normals_dim(Mesh* mesh, Bytes sides_are_exposed,
    Bytes verts_matter,
    Real simple_algorithm_threshold = 0.95)  // constant given by Aubry and Lohner
{
  constexpr auto side_dim = dim - 1;
  auto v2s = mesh->ask_up(VERT, side_dim);
  auto sv2v = mesh->ask_verts_of(side_dim);
  auto verts_that_matter = collect_marked(verts_matter);
  auto coords = mesh->coords();
  auto out = Write<Real>(mesh->nverts() * dim, 0.0);
  auto const threshold_copy = simple_algorithm_threshold;
  auto sides_are_exposed_copy = sides_are_exposed;
  auto f = OMEGA_H_LAMBDA(LO vm) {
    auto v = verts_that_matter[vm];
    auto N_c = zero_vector<dim>();
    constexpr auto max_adj_sides =
        SimplexAvgDegree<side_dim, VERT, side_dim>::value * 4;
    Few<Vector<dim>, max_adj_sides> N;
    auto n = 0;
    for (auto vs = v2s.a2ab[v]; vs < v2s.a2ab[v + 1]; ++vs) {
      auto s = v2s.ab2b[vs];
      if (!sides_are_exposed_copy[s]) continue;
      OMEGA_H_CHECK(n < max_adj_sides);
      constexpr auto side_dim2 = dim - 1;
      auto ssv2v = gather_verts<side_dim2 + 1>(sv2v, s);
      auto ssv2x = gather_vectors<side_dim2 + 1, dim>(coords, ssv2v);
      auto svec = get_side_vector(ssv2x);
      N_c += svec;  // svec is the area weighted face normal
      N[n++] = normalize(svec);
    }
    // as suggested by Aubry and Lohner, start with an initial guess done by
    // some kind of averaging (area weighted being an option)
    N_c = normalize(N_c);
    // if that is roughly the same as all the face normals, just accept it
    // and don't bother with the expensive algorithm.
    // this is especially a good idea because most models are mostly flat
    // surfaces
    Int i;
    for (i = 0; i < n; ++i) {
      if (N_c * N[i] < threshold_copy) break;
    }
    if (i < n) {
      // nope, we actually have some nontrivial normals here.
      // run the super expensive algorithm.
      N_c = get_most_normal_normal(N, n);
    }
    set_vector(out, v, N_c);
  };
  parallel_for(verts_that_matter.size(), f, "compute_flip_normals");
  return mesh->sync_array(VERT, Reals(out), dim);
}